

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O2

bool duckdb::Time::TryConvertInternal
               (char *buf,idx_t len,idx_t *pos,dtime_t *result,bool strict,
               optional_ptr<int,_true> nanos)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int *piVar5;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int32_t min;
  ulong local_48;
  int32_t sec;
  optional_ptr<int,_true> nanos_local;
  
  min = -1;
  sec = -1;
  *pos = 0;
  if (len != 0) {
    uVar3 = 0;
    while (uVar3 < len) {
      bVar6 = buf[uVar3];
      if ((0x20 < (ulong)bVar6) || ((0x100003e00U >> ((ulong)bVar6 & 0x3f) & 1) == 0)) {
        iVar12 = 0;
        iVar2 = 0;
        if (9 < (byte)(bVar6 - 0x30)) goto LAB_012aee87;
        lVar7 = 0;
        goto LAB_012aedc7;
      }
      uVar3 = uVar3 + 1;
      *pos = uVar3;
    }
  }
LAB_012aee85:
  iVar2 = 0;
  goto LAB_012aee87;
LAB_012aedc7:
  if (len <= uVar3 + lVar7) goto LAB_012aee85;
  if ((byte)(buf[uVar3 + lVar7] - 0x30U) < 10) {
    if ((int)lVar7 == 9) goto LAB_012aee85;
    iVar12 = iVar12 * 10 + (uint)(byte)buf[uVar3 + lVar7] + -0x30;
    *pos = uVar3 + lVar7 + 1;
    lVar7 = lVar7 + 1;
    goto LAB_012aedc7;
  }
  *pos = uVar3 + lVar7 + 1;
  if (buf[uVar3 + lVar7] != ':') goto LAB_012aee85;
  bVar6 = !strict;
  nanos_local.ptr = nanos.ptr;
  if ((uVar3 + lVar7) - len == -1 && (bool)bVar6) {
    uVar9 = 0;
    uVar4 = len;
LAB_012aee9d:
    uVar8 = 0;
    iVar10 = 0;
    if ((uVar3 - len) + lVar7 == -3 || bVar6 != 0) goto LAB_012aefb9;
  }
  else {
    local_48 = CONCAT71(local_48._1_7_,bVar6);
    bVar1 = Date::ParseDoubleDigit(buf,len,pos,&min);
    if (0x3b < (uint)min || !bVar1) goto LAB_012aee85;
    uVar4 = *pos;
    if (len < uVar4) goto LAB_012aee85;
    uVar9 = (ulong)(uint)min;
    bVar6 = (byte)local_48;
    if (uVar4 == len) goto LAB_012aee9d;
  }
  *pos = uVar4 + 1;
  iVar2 = 0;
  if (buf[uVar4] != ':') goto LAB_012aee87;
  if ((uVar4 + 1 == len & bVar6) == 0) {
    bVar1 = Date::ParseDoubleDigit(buf,len,pos,&sec);
    local_48 = (ulong)(uint)sec;
    iVar2 = 0;
    if (0x3b < (uint)sec || !bVar1) goto LAB_012aee87;
    uVar3 = *pos;
    uVar8 = local_48;
    iVar10 = 0;
    if ((uVar3 < len) && (iVar10 = iVar2, buf[uVar3] == '.')) {
      uVar3 = uVar3 + 1;
      iVar2 = 100000000;
      if (nanos.ptr == (int *)0x0) {
        iVar2 = 100000;
      }
      *pos = uVar3;
      iVar11 = 0;
      while ((uVar3 < len && ((byte)(buf[uVar3] - 0x30U) < 10))) {
        iVar10 = ((byte)buf[uVar3] - 0x30) * iVar2;
        if (iVar2 < 1) {
          iVar10 = 0;
        }
        iVar11 = iVar10 + iVar11;
        uVar3 = uVar3 + 1;
        *pos = uVar3;
        iVar2 = iVar2 / 10;
      }
      iVar10 = iVar11;
      if (nanos.ptr != (int *)0x0) {
        piVar5 = optional_ptr<int,_true>::operator*(&nanos_local);
        iVar10 = iVar11 / 1000;
        *piVar5 = iVar11 % 1000;
        uVar8 = local_48;
      }
    }
  }
  else {
    uVar8 = 0;
    iVar10 = 0;
  }
LAB_012aefb9:
  if (strict) {
    uVar3 = *pos;
    while (uVar3 < len) {
      if ((0x20 < (ulong)(byte)buf[uVar3]) ||
         ((0x100003e00U >> ((ulong)(byte)buf[uVar3] & 0x3f) & 1) == 0)) goto LAB_012aee85;
      uVar3 = uVar3 + 1;
      *pos = uVar3;
    }
  }
  result->micros =
       (long)iVar10 + (((long)iVar12 * 0x3c + uVar9) * 0x3c + (uVar8 & 0xffffffff)) * 1000000;
  iVar2 = 1;
LAB_012aee87:
  return SUB41(iVar2,0);
}

Assistant:

bool Time::TryConvertInternal(const char *buf, idx_t len, idx_t &pos, dtime_t &result, bool strict,
                              optional_ptr<int32_t> nanos) {
	int32_t hour = -1, min = -1, sec = -1, micros = -1;
	pos = 0;

	if (len == 0) {
		return false;
	}

	int sep;

	// skip leading spaces
	while (pos < len && StringUtil::CharacterIsSpace(buf[pos])) {
		pos++;
	}

	if (pos >= len) {
		return false;
	}

	if (!StringUtil::CharacterIsDigit(buf[pos])) {
		return false;
	}

	// Allow up to 9 digit hours to support intervals
	hour = 0;
	for (int32_t digits = 9; pos < len && StringUtil::CharacterIsDigit(buf[pos]); ++pos) {
		if (digits-- > 0) {
			hour = hour * 10 + (buf[pos] - '0');
		} else {
			return false;
		}
	}

	if (pos >= len) {
		return false;
	}

	// fetch the separator
	sep = buf[pos++];
	if (sep != ':') {
		// invalid separator
		return false;
	}
	idx_t sep_pos = pos;
	if (pos == len && !strict) {
		min = 0;
	} else {
		if (!Date::ParseDoubleDigit(buf, len, pos, min)) {
			return false;
		}
		if (min < 0 || min >= 60) {
			return false;
		}
	}

	if (pos > len) {
		return false;
	}
	if (pos == len && (!strict || sep_pos + 2 == pos)) {
		sec = 0;
	} else {
		if (buf[pos++] != sep) {
			return false;
		}

		if (pos == len && !strict) {
			sec = 0;
		} else {
			if (!Date::ParseDoubleDigit(buf, len, pos, sec)) {
				return false;
			}
			if (sec < 0 || sec >= 60) {
				return false;
			}
		}
	}

	micros = 0;
	if (pos < len && buf[pos] == '.') {
		pos++;
		// we expect some microseconds
		int32_t mult = 100000;
		if (nanos) {
			// do we expect nanoseconds?
			mult *= Interval::NANOS_PER_MICRO;
		}
		for (; pos < len && StringUtil::CharacterIsDigit(buf[pos]); pos++, mult /= 10) {
			if (mult > 0) {
				micros += (buf[pos] - '0') * mult;
			}
		}
		if (nanos) {
			*nanos = UnsafeNumericCast<int32_t>(micros % Interval::NANOS_PER_MICRO);
			micros /= Interval::NANOS_PER_MICRO;
		}
	}

	// in strict mode, check remaining string for non-space characters
	if (strict) {
		// skip trailing spaces
		while (pos < len && StringUtil::CharacterIsSpace(buf[pos])) {
			pos++;
		}
		// check position. if end was not reached, non-space chars remaining
		if (pos < len) {
			return false;
		}
	}

	result = Time::FromTime(hour, min, sec, micros);
	return true;
}